

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O3

void __thiscall Clasp::Solver::removeConditional(Solver *this)

{
  pointer ppCVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar3;
  
  if (3 < (this->tag_).rep_) {
    uVar6 = (ulong)(this->learnts_).ebo_.size;
    if (uVar6 == 0) {
      sVar4 = 0;
    }
    else {
      uVar7 = 0;
      uVar5 = 0;
      do {
        iVar2 = (*(this->learnts_).ebo_.buf[uVar7]->_vptr_Constraint[9])();
        plVar3 = (long *)CONCAT44(extraout_var,iVar2);
        if ((plVar3 == (long *)0x0) || (-1 < (int)plVar3[2])) {
          ppCVar1 = (this->learnts_).ebo_.buf;
          ppCVar1[uVar5] = ppCVar1[uVar7];
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        else {
          (**(code **)(*plVar3 + 0x28))(plVar3,this,1);
        }
        sVar4 = (size_type)uVar5;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    (this->learnts_).ebo_.size = sVar4;
  }
  return;
}

Assistant:

inline bool    isSentinel(Literal p) { return p.var() == sentVar; }